

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O2

void __thiscall llbuild::core::Rule::~Rule(Rule *this)

{
  this->_vptr_Rule = (_func_int **)&PTR___cxa_pure_virtual_001db548;
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

Rule::~Rule() {}